

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<solitaire::geometry::Position_()>::Invoke
          (FunctionMocker<solitaire::geometry::Position_()> *this)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<solitaire::geometry::Position> *__p;
  pointer this_00;
  Position PVar1;
  Result RVar2;
  unique_ptr<testing::internal::ActionResultHolder<solitaire::geometry::Position>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
  local_28;
  unique_ptr<testing::internal::ActionResultHolder<solitaire::geometry::Position>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
  holder;
  ArgumentTuple tuple;
  FunctionMocker<solitaire::geometry::Position_()> *this_local;
  
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<solitaire::geometry::Position>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<solitaire::geometry::Position>_*,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
  .
  super__Head_base<0UL,_testing::internal::ActionResultHolder<solitaire::geometry::Position>_*,_false>
  ._M_head_impl._7_1_ = 0;
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (void *)((long)&holder._M_t.
                                 super___uniq_ptr_impl<testing::internal::ActionResultHolder<solitaire::geometry::Position>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<solitaire::geometry::Position>_*,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
                                 .
                                 super__Head_base<0UL,_testing::internal::ActionResultHolder<solitaire::geometry::Position>_*,_false>
                                 ._M_head_impl + 7));
  __p = DownCast_<testing::internal::ActionResultHolder<solitaire::geometry::Position>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<solitaire::geometry::Position>,std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<solitaire::geometry::Position>,std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>>>
              *)&local_28,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<solitaire::geometry::Position>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
            ::operator->(&local_28);
  PVar1 = ActionResultHolder<solitaire::geometry::Position>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<solitaire::geometry::Position>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::geometry::Position>_>_>
  ::~unique_ptr(&local_28);
  RVar2.x = PVar1.x;
  RVar2.y = PVar1.y;
  return RVar2;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }